

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void get_ea_mode_op(m68k_info *info,cs_m68k_op *op,uint instruction,uint size)

{
  uint uVar1;
  unsigned_long_long uVar2;
  int in_ECX;
  m68k_info *info_00;
  uint in_EDX;
  unsigned_long_long *in_RSI;
  undefined8 in_RDI;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  cs_m68k_op *in_stack_00000008;
  _Bool is_pc;
  
  *(undefined4 *)(in_RSI + 6) = 3;
  info_00 = (m68k_info *)(ulong)(in_EDX & 0x3f);
  is_pc = SUB81((ulong)in_RDI >> 0x38,0);
  switch(info_00) {
  case (m68k_info *)0x0:
  case (m68k_info *)0x1:
  case (m68k_info *)0x2:
  case (m68k_info *)0x3:
  case (m68k_info *)0x4:
  case (m68k_info *)0x5:
  case (m68k_info *)0x6:
  case (m68k_info *)0x7:
    *(undefined4 *)((long)in_RSI + 0x34) = 1;
    *(uint *)in_RSI = (in_EDX & 7) + 1;
    *(undefined4 *)(in_RSI + 6) = 1;
    break;
  case (m68k_info *)0x8:
  case (m68k_info *)0x9:
  case (m68k_info *)0xa:
  case (m68k_info *)0xb:
  case (m68k_info *)0xc:
  case (m68k_info *)0xd:
  case (m68k_info *)0xe:
  case (m68k_info *)0xf:
    *(undefined4 *)((long)in_RSI + 0x34) = 2;
    *(uint *)in_RSI = (in_EDX & 7) + 9;
    *(undefined4 *)(in_RSI + 6) = 1;
    break;
  case (m68k_info *)0x10:
  case (m68k_info *)0x11:
  case (m68k_info *)0x12:
  case (m68k_info *)0x13:
  case (m68k_info *)0x14:
  case (m68k_info *)0x15:
  case (m68k_info *)0x16:
  case (m68k_info *)0x17:
    *(undefined4 *)((long)in_RSI + 0x34) = 3;
    *(uint *)in_RSI = (in_EDX & 7) + 9;
    break;
  case (m68k_info *)0x18:
  case (m68k_info *)0x19:
  case (m68k_info *)0x1a:
  case (m68k_info *)0x1b:
  case (m68k_info *)0x1c:
  case (m68k_info *)0x1d:
  case (m68k_info *)0x1e:
  case (m68k_info *)0x1f:
    *(undefined4 *)((long)in_RSI + 0x34) = 4;
    *(uint *)in_RSI = (in_EDX & 7) + 9;
    break;
  case (m68k_info *)0x20:
  case (m68k_info *)0x21:
  case (m68k_info *)0x22:
  case (m68k_info *)0x23:
  case (m68k_info *)0x24:
  case (m68k_info *)0x25:
  case (m68k_info *)0x26:
  case (m68k_info *)0x27:
    *(undefined4 *)((long)in_RSI + 0x34) = 5;
    *(uint *)in_RSI = (in_EDX & 7) + 9;
    break;
  case (m68k_info *)0x28:
  case (m68k_info *)0x29:
  case (m68k_info *)0x2a:
  case (m68k_info *)0x2b:
  case (m68k_info *)0x2c:
  case (m68k_info *)0x2d:
  case (m68k_info *)0x2e:
  case (m68k_info *)0x2f:
    *(undefined4 *)((long)in_RSI + 0x34) = 6;
    *(uint *)(in_RSI + 1) = (in_EDX & 7) + 9;
    uVar1 = read_imm_16(info_00);
    *(short *)((long)in_RSI + 0x1c) = (short)uVar1;
    break;
  case (m68k_info *)0x30:
  case (m68k_info *)0x31:
  case (m68k_info *)0x32:
  case (m68k_info *)0x33:
  case (m68k_info *)0x34:
  case (m68k_info *)0x35:
  case (m68k_info *)0x36:
  case (m68k_info *)0x37:
    get_with_index_address_mode
              ((m68k_info *)CONCAT44(instruction,size),in_stack_00000008,unaff_retaddr_00,
               unaff_retaddr,is_pc);
    break;
  case (m68k_info *)0x38:
    *(undefined4 *)((long)in_RSI + 0x34) = 0x10;
    uVar1 = read_imm_16(info_00);
    *in_RSI = (ulong)uVar1;
    break;
  case (m68k_info *)0x39:
    *(undefined4 *)((long)in_RSI + 0x34) = 0x11;
    uVar1 = read_imm_32(info_00);
    *in_RSI = (ulong)uVar1;
    break;
  case (m68k_info *)0x3a:
    *(undefined4 *)((long)in_RSI + 0x34) = 0xb;
    uVar1 = read_imm_16(info_00);
    *(short *)((long)in_RSI + 0x1c) = (short)uVar1;
    break;
  case (m68k_info *)0x3b:
    get_with_index_address_mode
              ((m68k_info *)CONCAT44(instruction,size),in_stack_00000008,unaff_retaddr_00,
               unaff_retaddr,is_pc);
    break;
  case (m68k_info *)0x3c:
    *(undefined4 *)((long)in_RSI + 0x34) = 0x12;
    *(undefined4 *)(in_RSI + 6) = 2;
    if (in_ECX == 1) {
      uVar1 = read_imm_8(info_00);
      *in_RSI = (ulong)(uVar1 & 0xff);
    }
    else if (in_ECX == 2) {
      uVar1 = read_imm_16(info_00);
      *in_RSI = (ulong)(uVar1 & 0xffff);
    }
    else if (in_ECX == 4) {
      uVar1 = read_imm_32(info_00);
      *in_RSI = (ulong)uVar1;
    }
    else {
      uVar2 = read_imm_64(info_00);
      *in_RSI = uVar2;
    }
  }
  return;
}

Assistant:

static void get_ea_mode_op(m68k_info *info, cs_m68k_op* op, uint instruction, uint size)
{
	// default to memory

	op->type = M68K_OP_MEM;

	switch (instruction & 0x3f) {
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
			/* data register direct */
			op->address_mode = M68K_AM_REG_DIRECT_DATA;
			op->reg = M68K_REG_D0 + (instruction & 7);
			op->type = M68K_OP_REG;
			break;

		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
			/* address register direct */
			op->address_mode = M68K_AM_REG_DIRECT_ADDR;
			op->reg = M68K_REG_A0 + (instruction & 7);
			op->type = M68K_OP_REG;
			break;

		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
			/* address register indirect */
			op->address_mode = M68K_AM_REGI_ADDR;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
			/* address register indirect with postincrement */
			op->address_mode = M68K_AM_REGI_ADDR_POST_INC;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
			/* address register indirect with predecrement */
			op->address_mode = M68K_AM_REGI_ADDR_PRE_DEC;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
			/* address register indirect with displacement*/
			op->address_mode = M68K_AM_REGI_ADDR_DISP;
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			op->mem.disp = (int16_t)read_imm_16(info);
			break;

		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
			/* address register indirect with index */
			get_with_index_address_mode(info, op, instruction, size, false);
			break;

		case 0x38:
			/* absolute short address */
			op->address_mode = M68K_AM_ABSOLUTE_DATA_SHORT;
			op->imm = read_imm_16(info);
			break;

		case 0x39:
			/* absolute long address */
			op->address_mode = M68K_AM_ABSOLUTE_DATA_LONG;
			op->imm = read_imm_32(info);
			break;

		case 0x3a:
			/* program counter with displacement */
			op->address_mode = M68K_AM_PCI_DISP;
			op->mem.disp = (int16_t)read_imm_16(info);
			break;

		case 0x3b:
			/* program counter with index */
			get_with_index_address_mode(info, op, instruction, size, true);
			break;

		case 0x3c:
			op->address_mode = M68K_AM_IMMEDIATE;
			op->type = M68K_OP_IMM;

			if (size == 1)
				op->imm = read_imm_8(info) & 0xff;
			else if (size == 2)
				op->imm = read_imm_16(info) & 0xffff;
			else if (size == 4)
				op->imm = read_imm_32(info);
			else
				op->imm = read_imm_64(info);

			break;

		default:
			break;
	}
}